

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_main.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  FILE *__stream;
  long lVar4;
  long lVar5;
  __sighandler_t p_Var6;
  dtl_hv_t *config;
  undefined8 uStack_60;
  _Bool ok;
  
  m_shutdownTimer = 10;
  m_runFlag = 1;
  if ((uint)argc < 2) {
    printf("Usage:\n%s configFile.json\n",*argv);
    return 0;
  }
  bVar1 = false;
  printf("APX Server %s\n\n","0.3.1");
  if (argv[1] == (char *)0x0) {
    uStack_60 = 1;
    lVar4 = 0;
  }
  else {
    __stream = fopen(argv[1],"r");
    if (__stream == (FILE *)0x0) {
      uStack_60 = 0x31;
    }
    else {
      lVar4 = dtl_json_load(__stream);
      fclose(__stream);
      uStack_60 = 0;
      if (lVar4 == 0) {
        uStack_60 = 3;
      }
      else {
        iVar2 = dtl_dv_type(lVar4);
        bVar1 = true;
        if (iVar2 == 4) goto LAB_001012ff;
        dtl_dv_dec_ref(lVar4);
        uStack_60 = 0x43;
      }
    }
    lVar4 = 0;
    bVar1 = false;
  }
LAB_001012ff:
  printf("Loading %s: ",argv[1]);
  if (bVar1) {
    puts("OK");
    lVar5 = dtl_hv_get_cstr(lVar4,"server");
    if ((((lVar5 != 0) && (iVar2 = dtl_dv_type(lVar5), iVar2 == 4)) &&
        (lVar5 = dtl_hv_get_cstr(lVar5,"shutdown-timer"), lVar5 != 0)) &&
       (iVar3 = dtl_sv_to_i32(lVar5,&ok), ok == true)) {
      m_shutdownTimer = iVar3;
    }
    p_Var6 = signal(2,signal_handler);
    if (p_Var6 == (__sighandler_t)0x1) {
      signal(2,(__sighandler_t)0x1);
    }
    p_Var6 = signal(0xf,signal_handler);
    if (p_Var6 == (__sighandler_t)0x1) {
      signal(0xf,(__sighandler_t)0x1);
    }
    apx_server_create(&m_server);
    if (((lVar4 != 0) &&
        (config = (dtl_hv_t *)dtl_hv_get_cstr(lVar4,"extension"), config != (dtl_hv_t *)0x0)) &&
       (iVar2 = dtl_dv_type(config), iVar2 == 4)) {
      register_apx_server_extensions(&m_server,config);
    }
    apx_server_start(&m_server);
    while (iVar3 = m_shutdownTimer, m_runFlag != 0) {
      usleep(1000000);
      if (0 < m_shutdownTimer) {
        iVar3 = m_shutdownTimer + -1;
        if (iVar3 == 0) break;
        bVar1 = (uint)m_shutdownTimer < 0xb;
        m_shutdownTimer = iVar3;
        if (bVar1) {
          sprintf(&ok,"Shutdown in %ds");
          apx_server_log_event(&m_server,3,"main",&ok);
        }
      }
    }
    m_shutdownTimer = iVar3;
    puts("Server shutdown started");
    apx_server_destroy(&m_server);
    dtl_dv_dec_ref(lVar4);
    puts("Server shutdown complete");
    iVar2 = 0;
  }
  else {
    printf("Error %d\n",uStack_60);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char **argv)
{
   apx_error_t result;
   dtl_hv_t *server_config = (dtl_hv_t*) 0;

   m_shutdownTimer = SHUTDOWN_TIMER_INIT;   
   m_runFlag = 1;

   if (argc < 2u)
   {
      printUsage(argv[0]);
      return 0;
   }
   printf("APX Server %s\n\n", SW_VERSION_STR);
   result = load_config_file(argv[1], &server_config);
   printf("Loading %s: ", argv[1]);
   if (result != APX_NO_ERROR)
   {
      printf("Error %d\n", (int) result);
      return 1;
   }
   else
   {
      printf("OK\n");
      dtl_dv_t *tmp = dtl_hv_get_cstr(server_config, "server");
      if ( (tmp != 0) && (dtl_dv_type(tmp) == DTL_DV_HASH) )
      {
         int32_t i32;
         bool ok;
         dtl_hv_t *serverCfg = (dtl_hv_t*) tmp;
         dtl_sv_t *svShutdownTimer = (dtl_sv_t*) dtl_hv_get_cstr(serverCfg, "shutdown-timer");
         if (svShutdownTimer != 0)
         {
            i32 = dtl_sv_to_i32(svShutdownTimer, &ok);
            if (ok)
            {
               m_shutdownTimer = i32;
            }
         }
      }
   }

#ifdef _WIN32
   if (init_wsa() != 0)
   {
      int err = WSAGetLastError();
      fprintf(stderr, "WSAStartup failed with error: %d\n", err);
      return 1;
   }
#else
   signal_handler_setup();
#endif
   apx_server_create(&m_server);
   if (server_config != 0)
   {
      dtl_dv_t *extension_config = (dtl_dv_t*) 0;
      extension_config = dtl_hv_get_cstr(server_config, "extension");
      if ( (extension_config != 0) && (dtl_dv_type(extension_config) == DTL_DV_HASH) )
      {
         register_apx_server_extensions(&m_server, (dtl_hv_t*) extension_config);
      }
   }
   apx_server_start(&m_server);
   while(m_runFlag != 0)
   {
      SLEEP(1000); //main thread is sleeping while child threads do all the work
      if (m_shutdownTimer > 0)
      {
         if (--m_shutdownTimer==0) //this counter is used during a cleanup test to verify that all resources are properly cleaned up
         {
            break;
         }
         if (m_shutdownTimer < SHUTDOWN_TIMER_WARN_THRESHOLD)
         {
            char msg[40];
            sprintf(msg, "Shutdown in %ds", m_shutdownTimer);
            apx_server_log_event(&m_server, APX_LOG_LEVEL_INFO, "main", msg);
         }
      }
   }
   printf("Server shutdown started\n");
   apx_server_destroy(&m_server);
   dtl_dec_ref(server_config);
   printf("Server shutdown complete\n");
#ifdef _WIN32
   WSACleanup();
#endif
#if defined(_MSC_VER) && (CLEANUP_TEST != 0)
   _CrtDumpMemoryLeaks();
#endif
   return 0;
}